

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_23::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  ostream *poVar1;
  char *in_RSI;
  
  poVar1 = cout();
  poVar1 = std::operator<<(poVar1,'\x1b');
  std::operator<<(poVar1,in_RSI);
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            Catch::cout() << '\033' << _escapeCode;
        }